

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtContinuousConvexCollision.cpp
# Opt level: O3

void __thiscall
cbtContinuousConvexCollision::computeClosestPoints
          (cbtContinuousConvexCollision *this,cbtTransform *transA,cbtTransform *transB,
          cbtPointCollector *pointCollector)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  float fVar4;
  cbtScalar cVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int shapeTypeB;
  int shapeTypeA;
  cbtConvexShape *pcVar9;
  cbtConvexShape *objectA;
  cbtStaticPlaneShape *pcVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  cbtScalar in_XMM0_Da;
  cbtScalar cVar29;
  cbtScalar acVar30 [4];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ClosestPointInput input;
  cbtGjkPairDetector gjk;
  undefined1 local_128 [8];
  cbtScalar cStack_120;
  cbtScalar local_118;
  float fStack_114;
  cbtScalar acStack_110 [2];
  cbtScalar local_108;
  float fStack_104;
  cbtScalar acStack_100 [2];
  float local_f8;
  float fStack_f4;
  float afStack_f0 [2];
  cbtScalar local_e8 [2];
  cbtScalar acStack_e0 [2];
  cbtScalar local_d8 [2];
  cbtScalar acStack_d0 [2];
  cbtScalar local_c8 [2];
  cbtScalar acStack_c0 [2];
  cbtScalar local_b8 [2];
  cbtScalar acStack_b0 [2];
  cbtScalar local_a8;
  cbtGjkPairDetector local_98;
  
  if (this->m_convexB1 == (cbtConvexShape *)0x0) {
    fVar1 = (transA->m_basis).m_el[1].m_floats[2];
    cVar29 = (transA->m_basis).m_el[2].m_floats[2];
    cVar2 = (transA->m_basis).m_el[0].m_floats[2];
    pcVar9 = this->m_convexA;
    pcVar10 = this->m_planeShape;
    cVar3 = (transA->m_origin).m_floats[0];
    fVar4 = (transA->m_origin).m_floats[1];
    cVar5 = (transA->m_origin).m_floats[2];
    uVar6 = *(ulong *)(transA->m_basis).m_el[0].m_floats;
    uVar7 = *(ulong *)(transA->m_basis).m_el[1].m_floats;
    uVar8 = *(ulong *)(transA->m_basis).m_el[2].m_floats;
    _local_128 = stack0xfffffffffffffedc;
    cbtTransform::inverse(transB);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar7;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar6;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar8;
    auVar15 = vmulss_avx512f(auVar46,ZEXT416((uint)local_128._4_4_));
    auVar16 = vmovshdup_avx512vl(auVar25);
    auVar17 = vmovshdup_avx512vl(auVar26);
    auVar18 = vmulss_avx512f(auVar46,ZEXT416((uint)fStack_114));
    auVar19 = vmulss_avx512f(auVar46,ZEXT416((uint)fStack_104));
    auVar15 = vfmadd231ss_avx512f(auVar15,auVar25,ZEXT416((uint)local_128._0_4_));
    auVar20 = vfmadd231ss_avx512f(auVar15,auVar26,ZEXT416((uint)cStack_120));
    auVar15 = vmovshdup_avx512vl(auVar46);
    fVar34 = auVar15._0_4_;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (float)local_128._4_4_)),auVar16,
                              ZEXT416((uint)local_128._0_4_));
    auVar28 = vfmadd231ss_fma(auVar15,auVar17,ZEXT416((uint)cStack_120));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (float)local_128._4_4_)),ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_128._0_4_));
    auVar27 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar29),ZEXT416((uint)cStack_120));
    auVar15 = vfmadd231ss_avx512f(auVar18,auVar25,ZEXT416((uint)local_118));
    auVar21 = vfmadd231ss_avx512f(auVar15,auVar26,ZEXT416((uint)acStack_110[0]));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fStack_114)),auVar16,ZEXT416((uint)local_118))
    ;
    auVar18 = vfmadd231ss_fma(auVar15,auVar17,ZEXT416((uint)acStack_110[0]));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fStack_114)),ZEXT416((uint)cVar2),
                              ZEXT416((uint)local_118));
    auVar39 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar29),ZEXT416((uint)acStack_110[0]));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fStack_104 * fVar34)),ZEXT416((uint)local_108),auVar16)
    ;
    auVar19 = vfmadd231ss_avx512f(auVar19,auVar25,ZEXT416((uint)local_108));
    auVar16 = vfmadd231ss_fma(auVar15,ZEXT416((uint)acStack_100[0]),auVar17);
    auVar22 = vfmadd231ss_avx512f(auVar19,auVar26,ZEXT416((uint)acStack_100[0]));
    auVar35 = ZEXT416((uint)cVar2);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fStack_104)),auVar35,ZEXT416((uint)local_108));
    auVar43 = ZEXT416((uint)cVar29);
    auVar17 = vfmadd231ss_fma(auVar15,auVar43,ZEXT416((uint)acStack_100[0]));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_128._4_4_)),ZEXT416((uint)cVar3),
                              ZEXT416((uint)local_128._0_4_));
    cVar29 = (transB->m_basis).m_el[2].m_floats[1];
    auVar38._4_4_ = cVar29;
    auVar38._0_4_ = cVar29;
    auVar38._8_4_ = cVar29;
    auVar38._12_4_ = cVar29;
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fStack_114)),ZEXT416((uint)cVar3),
                              ZEXT416((uint)local_118));
    cVar29 = (transB->m_basis).m_el[0].m_floats[1];
    auVar36._4_4_ = cVar29;
    auVar36._0_4_ = cVar29;
    auVar36._8_4_ = cVar29;
    auVar36._12_4_ = cVar29;
    auVar44 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar5),ZEXT416((uint)cStack_120));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar5),ZEXT416((uint)acStack_110[0]));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fStack_104 * fVar4)),ZEXT416((uint)cVar3),
                              ZEXT416((uint)local_108));
    fVar4 = (transB->m_basis).m_el[1].m_floats[2];
    auVar40._4_4_ = fVar4;
    auVar40._0_4_ = fVar4;
    auVar40._8_4_ = fVar4;
    auVar40._12_4_ = fVar4;
    cVar29 = (transB->m_basis).m_el[0].m_floats[2];
    auVar41._4_4_ = cVar29;
    auVar41._0_4_ = cVar29;
    auVar41._8_4_ = cVar29;
    auVar41._12_4_ = cVar29;
    auVar45 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar5),ZEXT416((uint)acStack_100[0]));
    fVar34 = (transB->m_basis).m_el[1].m_floats[1];
    auVar24._4_4_ = fVar34;
    auVar24._0_4_ = fVar34;
    auVar24._8_4_ = fVar34;
    auVar24._12_4_ = fVar34;
    cVar29 = (transB->m_basis).m_el[2].m_floats[2];
    auVar42._4_4_ = cVar29;
    auVar42._0_4_ = cVar29;
    auVar42._8_4_ = cVar29;
    auVar42._12_4_ = cVar29;
    cVar29 = (transB->m_basis).m_el[0].m_floats[0];
    auVar31._4_4_ = cVar29;
    auVar31._0_4_ = cVar29;
    auVar31._8_4_ = cVar29;
    auVar31._12_4_ = cVar29;
    auVar15 = vmulps_avx512vl(auVar46,auVar40);
    cVar29 = (transB->m_basis).m_el[2].m_floats[0];
    auVar33._4_4_ = cVar29;
    auVar33._0_4_ = cVar29;
    auVar33._8_4_ = cVar29;
    auVar33._12_4_ = cVar29;
    auVar15 = vfmadd231ps_avx512vl(auVar15,auVar41,auVar25);
    auVar23 = vmulps_avx512vl(auVar46,auVar24);
    auVar23 = vfmadd231ps_avx512vl(auVar23,auVar36,auVar25);
    auVar24 = vfmadd231ps_avx512vl(auVar15,auVar42,auVar26);
    fVar32 = (transB->m_basis).m_el[1].m_floats[0];
    auVar15._4_4_ = fVar32;
    auVar15._0_4_ = fVar32;
    auVar15._8_4_ = fVar32;
    auVar15._12_4_ = fVar32;
    auVar23 = vfmadd231ps_avx512vl(auVar23,auVar38,auVar26);
    auVar15 = vmulps_avx512vl(auVar46,auVar15);
    auVar25 = vfmadd231ps_avx512vl(auVar15,auVar31,auVar25);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar32)),auVar35,auVar31);
    fVar32 = (pcVar10->m_planeNormal).m_floats[1];
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar34)),auVar35,auVar36);
    cVar29 = (pcVar10->m_planeNormal).m_floats[0];
    auVar37._4_4_ = cVar29;
    auVar37._0_4_ = cVar29;
    auVar37._8_4_ = cVar29;
    auVar37._12_4_ = cVar29;
    auVar26 = vfmadd231ps_avx512vl(auVar25,auVar33,auVar26);
    auVar15 = vfmadd231ss_fma(auVar15,auVar43,auVar33);
    auVar46 = vfmadd231ss_fma(auVar46,auVar43,auVar38);
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar4)),auVar41,auVar35);
    auVar35._0_4_ = auVar23._0_4_ * fVar32;
    auVar35._4_4_ = auVar23._4_4_ * fVar32;
    auVar35._8_4_ = auVar23._8_4_ * fVar32;
    auVar35._12_4_ = auVar23._12_4_ * fVar32;
    auVar25 = vfmadd231ss_fma(auVar25,auVar42,auVar43);
    auVar26 = vfnmsub231ps_fma(auVar35,auVar37,auVar26);
    cVar29 = (pcVar10->m_planeNormal).m_floats[2];
    auVar23._4_4_ = cVar29;
    auVar23._0_4_ = cVar29;
    auVar23._8_4_ = cVar29;
    auVar23._12_4_ = cVar29;
    auVar46 = vfnmsub231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar32)),auVar37,auVar15);
    auVar15 = vfnmadd231ps_fma(auVar26,auVar23,auVar24);
    auVar46 = vfnmadd231ss_fma(auVar46,auVar23,auVar25);
    acVar30 = (cbtScalar  [4])vinsertps_avx(auVar15,auVar46,0x28);
    _local_128 = acVar30;
    (*(pcVar9->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])(pcVar9,local_128);
    auVar15 = vmovshdup_avx((undefined1  [16])acVar30);
    fVar32 = auVar15._0_4_;
    fVar1 = (pcVar10->m_planeNormal).m_floats[1];
    fVar4 = (pcVar10->m_planeNormal).m_floats[2];
    fVar34 = (transB->m_basis).m_el[1].m_floats[1];
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * auVar18._0_4_)),(undefined1  [16])acVar30,
                              ZEXT416(auVar21._0_4_));
    auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * auVar28._0_4_)),(undefined1  [16])acVar30,
                              ZEXT416(auVar20._0_4_));
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * auVar16._0_4_)),(undefined1  [16])acVar30,
                              ZEXT416(auVar22._0_4_));
    auVar15 = vfmadd231ss_fma(auVar15,auVar46,ZEXT416(auVar39._0_4_));
    auVar28 = vfmadd231ss_fma(auVar28,auVar46,ZEXT416(auVar27._0_4_));
    auVar27 = vfmadd231ss_fma(auVar18,auVar46,ZEXT416(auVar17._0_4_));
    fVar11 = auVar15._0_4_ + auVar19._0_4_ + fStack_f4;
    fVar12 = auVar28._0_4_ + auVar44._0_4_ + local_f8;
    fVar13 = auVar27._0_4_ + auVar45._0_4_ + afStack_f0[0];
    fVar32 = (pcVar10->m_planeNormal).m_floats[0];
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar11)),ZEXT416((uint)fVar32),
                              ZEXT416((uint)fVar12));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar4),ZEXT416((uint)fVar13));
    fVar14 = auVar15._0_4_ - pcVar10->m_planeConstant;
    fVar12 = fVar12 - fVar32 * fVar14;
    fVar11 = fVar11 - fVar1 * fVar14;
    fVar13 = fVar13 - fVar4 * fVar14;
    auVar25 = ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[1]);
    auVar27 = vmulss_avx512f(auVar25,ZEXT416((uint)fVar11));
    auVar45 = ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[1]);
    auVar28 = vmulss_avx512f(ZEXT416((uint)fVar11),auVar45);
    auVar17 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar11)),ZEXT416((uint)fVar12),auVar17);
    auVar44 = ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]);
    auVar28 = vfmadd231ss_fma(auVar28,auVar44,ZEXT416((uint)fVar12));
    auVar39 = ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]);
    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar12),auVar39);
    auVar46 = ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]);
    auVar18 = vfmadd231ss_avx512f(auVar28,auVar46,ZEXT416((uint)fVar13));
    auVar19 = ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]);
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar13),auVar19);
    auVar16 = ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]);
    auVar28 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar13),auVar16);
    auVar15 = vinsertps_avx(ZEXT416((uint)(auVar28._0_4_ + (transB->m_origin).m_floats[0])),
                            ZEXT416((uint)(auVar15._0_4_ + (transB->m_origin).m_floats[1])),0x10);
    _local_128 = (cbtScalar  [4])
                 vinsertps_avx(auVar15,ZEXT416((uint)(auVar18._0_4_ + (transB->m_origin).m_floats[2]
                                                     )),0x28);
    auVar28 = vmulss_avx512f(ZEXT416((uint)fVar1),auVar25);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar1)),ZEXT416((uint)fVar32),auVar17);
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar32),auVar39);
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar4),auVar19);
    auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar4),auVar16);
    auVar15 = vinsertps_avx(auVar28,auVar15,0x10);
    auVar28 = vmulss_avx512f(ZEXT416((uint)fVar1),auVar45);
    auVar28 = vfmadd231ss_fma(auVar28,auVar44,ZEXT416((uint)fVar32));
    auVar28 = vfmadd231ss_avx512f(auVar28,auVar46,ZEXT416((uint)fVar4));
    local_98._0_16_ = vinsertps_avx(auVar15,auVar28,0x28);
    (*(pointCollector->super_Result)._vptr_Result[4])(pointCollector,&local_98,local_128);
  }
  else {
    cbtVoronoiSimplexSolver::reset(this->m_simplexSolver);
    pcVar9 = this->m_convexB1;
    objectA = this->m_convexA;
    shapeTypeB = (pcVar9->super_cbtCollisionShape).m_shapeType;
    shapeTypeA = (objectA->super_cbtCollisionShape).m_shapeType;
    (*(objectA->super_cbtCollisionShape)._vptr_cbtCollisionShape[0xc])(objectA);
    cVar29 = in_XMM0_Da;
    (*(this->m_convexB1->super_cbtCollisionShape)._vptr_cbtCollisionShape[0xc])();
    cbtGjkPairDetector::cbtGjkPairDetector
              (&local_98,objectA,pcVar9,shapeTypeA,shapeTypeB,in_XMM0_Da,cVar29,
               this->m_simplexSolver,this->m_penetrationDepthSolver);
    local_a8 = 1e+18;
    _local_128 = *&(transA->m_basis).m_el[0].m_floats;
    _local_118 = *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
    acStack_110 = *(cbtScalar (*) [2])((transA->m_basis).m_el[1].m_floats + 2);
    _local_108 = *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
    acStack_100 = *(cbtScalar (*) [2])((transA->m_basis).m_el[2].m_floats + 2);
    _local_f8 = *(undefined8 *)(transA->m_origin).m_floats;
    afStack_f0 = *(float (*) [2])((transA->m_origin).m_floats + 2);
    local_e8 = *(cbtScalar (*) [2])(transB->m_basis).m_el[0].m_floats;
    acStack_e0 = *(cbtScalar (*) [2])((transB->m_basis).m_el[0].m_floats + 2);
    local_d8 = *(cbtScalar (*) [2])(transB->m_basis).m_el[1].m_floats;
    acStack_d0 = *(cbtScalar (*) [2])((transB->m_basis).m_el[1].m_floats + 2);
    local_c8 = *(cbtScalar (*) [2])(transB->m_basis).m_el[2].m_floats;
    acStack_c0 = *(cbtScalar (*) [2])((transB->m_basis).m_el[2].m_floats + 2);
    local_b8 = *(cbtScalar (*) [2])(transB->m_origin).m_floats;
    acStack_b0 = *(cbtScalar (*) [2])((transB->m_origin).m_floats + 2);
    cbtGjkPairDetector::getClosestPoints
              (&local_98,(ClosestPointInput *)local_128,&pointCollector->super_Result,
               (cbtIDebugDraw *)0x0,false);
  }
  return;
}

Assistant:

void cbtContinuousConvexCollision::computeClosestPoints(const cbtTransform& transA, const cbtTransform& transB, cbtPointCollector& pointCollector)
{
	if (m_convexB1)
	{
		m_simplexSolver->reset();
		cbtGjkPairDetector gjk(m_convexA, m_convexB1, m_convexA->getShapeType(), m_convexB1->getShapeType(), m_convexA->getMargin(), m_convexB1->getMargin(), m_simplexSolver, m_penetrationDepthSolver);
		cbtGjkPairDetector::ClosestPointInput input;
		input.m_transformA = transA;
		input.m_transformB = transB;
		gjk.getClosestPoints(input, pointCollector, 0);
	}
	else
	{
		//convex versus plane
		const cbtConvexShape* convexShape = m_convexA;
		const cbtStaticPlaneShape* planeShape = m_planeShape;

		const cbtVector3& planeNormal = planeShape->getPlaneNormal();
		const cbtScalar& planeConstant = planeShape->getPlaneConstant();

		cbtTransform convexWorldTransform = transA;
		cbtTransform convexInPlaneTrans;
		convexInPlaneTrans = transB.inverse() * convexWorldTransform;
		cbtTransform planeInConvex;
		planeInConvex = convexWorldTransform.inverse() * transB;

		cbtVector3 vtx = convexShape->localGetSupportingVertex(planeInConvex.getBasis() * -planeNormal);

		cbtVector3 vtxInPlane = convexInPlaneTrans(vtx);
		cbtScalar distance = (planeNormal.dot(vtxInPlane) - planeConstant);

		cbtVector3 vtxInPlaneProjected = vtxInPlane - distance * planeNormal;
		cbtVector3 vtxInPlaneWorld = transB * vtxInPlaneProjected;
		cbtVector3 normalOnSurfaceB = transB.getBasis() * planeNormal;

		pointCollector.addContactPoint(
			normalOnSurfaceB,
			vtxInPlaneWorld,
			distance);
	}
}